

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O0

Float __thiscall
pbrt::LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
          (LayeredBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this,Vector3f wo,
          Vector3f wi,TransportMode mode,BxDFReflTransFlags sampleFlags)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  Vector3f wi_00;
  Vector3<float> args;
  Vector3f wo_00;
  Vector3f wi_01;
  Vector3f wo_01;
  bool bVar3;
  uint64_t uVar4;
  int in_EDX;
  TransportMode in_ESI;
  long in_RDI;
  float fVar5;
  Float FVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar17 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar16 [64];
  float in_XMM1_Da;
  undefined1 in_ZMM2 [64];
  float in_XMM3_Da;
  Vector3<float> VVar18;
  BSDFSample wis_1;
  BSDFSample wos_1;
  Point2f u_1;
  Float uc_1;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> tiInterface;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> toInterface;
  BSDFSample wis;
  BSDFSample wos;
  Point2f u;
  Float uc;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> tInterface;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> rInterface;
  int s;
  Float pdfSum;
  bool enteredTop;
  anon_class_8_1_ba1d750b r;
  RNG rng;
  float in_stack_fffffffffffffc98;
  float in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  Float in_stack_fffffffffffffca4;
  int in_stack_fffffffffffffcb4;
  undefined4 in_stack_fffffffffffffcbc;
  float in_stack_fffffffffffffcc4;
  undefined8 in_stack_fffffffffffffcc8;
  float fVar19;
  undefined4 uStack_32c;
  undefined8 in_stack_fffffffffffffcd8;
  float in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  BxDFReflTransFlags in_stack_fffffffffffffcf0;
  float in_stack_fffffffffffffcf4;
  Vector3f *in_stack_fffffffffffffcf8;
  Float in_stack_fffffffffffffd04;
  Vector3f *in_stack_fffffffffffffd08;
  float in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  BxDFReflTransFlags in_stack_fffffffffffffd28;
  TransportMode in_stack_fffffffffffffd2c;
  undefined4 in_stack_fffffffffffffd30;
  float in_stack_fffffffffffffd34;
  Vector3f *in_stack_fffffffffffffd38;
  float in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd44;
  BSDFSample local_2ac;
  undefined8 local_288;
  BSDFSample local_280;
  undefined8 local_25c;
  float local_254;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_250;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_240;
  undefined8 local_230;
  float local_228;
  undefined8 local_21c;
  float local_214;
  undefined8 local_210;
  float local_208;
  undefined8 local_200;
  BxDFReflTransFlags in_stack_fffffffffffffe08;
  float in_stack_fffffffffffffe0c;
  DielectricInterfaceBxDF *in_stack_fffffffffffffe10;
  float local_1dc;
  float in_stack_fffffffffffffe2c;
  undefined8 in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe50;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_198;
  TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> local_188;
  int local_174;
  Tuple3<pbrt::Vector3,_float> local_170;
  Tuple3<pbrt::Vector3,_float> local_160;
  Tuple3<pbrt::Vector3,_float> local_150;
  Tuple3<pbrt::Vector3,_float> local_140;
  Tuple3<pbrt::Vector3,_float> local_130;
  Tuple3<pbrt::Vector3,_float> local_120;
  Tuple3<pbrt::Vector3,_float> local_110;
  Tuple3<pbrt::Vector3,_float> local_100;
  float local_f0;
  byte local_e9;
  undefined1 *local_e8;
  Tuple3<pbrt::Vector3,_float> local_e0;
  Tuple3<pbrt::Vector3,_float> local_d0;
  Tuple3<pbrt::Vector3,_float> local_c0;
  Tuple3<pbrt::Vector3,_float> local_b0;
  undefined1 local_a0 [16];
  Tuple3<pbrt::Vector3,_float> local_90;
  Tuple3<pbrt::Vector3,_float> local_7c;
  Tuple3<pbrt::Vector3,_float> local_70;
  Tuple3<pbrt::Vector3,_float> local_60;
  TransportMode local_4c;
  Tuple3<pbrt::Vector3,_float> local_3c;
  Tuple3<pbrt::Vector3,_float> local_2c;
  Tuple3<pbrt::Vector3,_float> local_20;
  Tuple3<pbrt::Vector3,_float> local_10;
  undefined1 auVar7 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_20._0_8_ = vmovlpd_avx(in_ZMM0._0_16_);
  local_3c._0_8_ = vmovlpd_avx(in_ZMM2._0_16_);
  fVar19 = (float)in_RDI;
  uStack_32c = (undefined4)((ulong)in_RDI >> 0x20);
  local_2c._0_8_ = local_3c._0_8_;
  local_10._0_8_ = local_20._0_8_;
  if (in_EDX == 3) {
    local_4c = in_ESI;
    local_2c.z = in_XMM3_Da;
    local_10.z = in_XMM1_Da;
    if ((*(char *)(in_RDI + 0x36) != '\0') &&
       (auVar17 = SUB6456(ZEXT1664((undefined1  [16])0x0),8), in_XMM1_Da < 0.0)) {
      VVar18 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      local_70.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar7._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar7._8_56_ = auVar17;
      local_70._0_8_ = vmovlpd_avx(auVar7._0_16_);
      local_60._0_8_ = local_70._0_8_;
      local_60.z = local_70.z;
      local_10._0_8_ = local_70._0_8_;
      local_10.z = local_70.z;
      VVar18 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)
                          CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
      local_90.z = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar17;
      local_90._0_8_ = vmovlpd_avx(auVar8._0_16_);
      local_7c._0_8_ = local_90._0_8_;
      local_7c.z = local_90.z;
      local_2c._0_8_ = local_90._0_8_;
      local_2c.z = local_90.z;
    }
    GetOptions();
    local_b0.z = local_10.z;
    local_b0.x = local_10.x;
    local_b0.y = local_10.y;
    local_c0.z = local_10.z;
    local_c0.x = local_10.x;
    local_c0.y = local_10.y;
    VVar18.super_Tuple3<pbrt::Vector3,_float>.z = fVar19;
    VVar18.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffcc8;
    VVar18.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
    uVar4 = Hash<int,pbrt::Vector3<float>>(in_stack_fffffffffffffcb4,VVar18);
    local_d0.z = local_2c.z;
    local_d0.x = local_2c.x;
    local_d0.y = local_2c.y;
    local_e0.z = local_2c.z;
    local_e0.x = local_2c.x;
    local_e0.y = local_2c.y;
    args.super_Tuple3<pbrt::Vector3,_float>.z = fVar19;
    args.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar4;
    args.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(uVar4 >> 0x20);
    Hash<pbrt::Vector3<float>>(args);
    RNG::RNG((RNG *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),0x835f68);
    local_e8 = local_a0;
    local_e9 = 0.0 < local_10.z;
    local_f0 = 0.0;
    bVar3 = SameHemisphere((Vector3f *)&local_10,(Vector3f *)&local_2c);
    if (bVar3) {
      if ((local_e9 & 1) == 0) {
        fVar5 = (float)*(byte *)(CONCAT44(uStack_32c,fVar19) + 0x35);
        local_140.z = local_10.z;
        local_140.x = local_10.x;
        local_140.y = local_10.y;
        local_150.z = local_2c.z;
        local_150.x = local_2c.x;
        local_150.y = local_2c.y;
        local_160.z = local_10.z;
        local_160.x = local_10.x;
        local_160.y = local_10.y;
        local_170.z = local_2c.z;
        local_170.x = local_2c.x;
        local_170.y = local_2c.y;
        wo_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffce0;
        wo_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)in_stack_fffffffffffffcd8;
        wo_00.super_Tuple3<pbrt::Vector3,_float>.y =
             (float)(int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
        wi_00.super_Tuple3<pbrt::Vector3,_float>.y = fVar5;
        wi_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffcbc;
        wi_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffcc4;
        auVar10._0_4_ =
             IdealDiffuseBxDF::PDF
                       ((IdealDiffuseBxDF *)
                        CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),wo_00,wi_00,
                        (TransportMode)in_stack_fffffffffffffc9c,
                        (BxDFReflTransFlags)in_stack_fffffffffffffc98);
        auVar10._4_60_ = extraout_var_00;
        auVar2 = vfmadd213ss_fma(auVar10._0_16_,ZEXT416((uint)fVar5),ZEXT416((uint)local_f0));
        local_f0 = auVar2._0_4_;
      }
      else {
        fVar5 = (float)*(byte *)(CONCAT44(uStack_32c,fVar19) + 0x35);
        local_100.z = local_10.z;
        local_100.x = local_10.x;
        local_100.y = local_10.y;
        local_110.z = local_2c.z;
        local_110.x = local_2c.x;
        local_110.y = local_2c.y;
        local_120.z = local_10.z;
        local_120.x = local_10.x;
        local_120.y = local_10.y;
        local_130.z = local_2c.z;
        local_130.x = local_2c.x;
        local_130.y = local_2c.y;
        wo_01.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffe50;
        wo_01.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_fffffffffffffe48;
        wo_01.super_Tuple3<pbrt::Vector3,_float>.y = SUB84(in_stack_fffffffffffffe48,4);
        wi_01.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_fffffffffffffe30;
        wi_01.super_Tuple3<pbrt::Vector3,_float>.z =
             (float)(int)((ulong)in_stack_fffffffffffffe30 >> 0x20);
        wi_01.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffe2c;
        auVar9._0_4_ = DielectricInterfaceBxDF::PDF
                                 (in_stack_fffffffffffffe10,wo_01,wi_01,
                                  (TransportMode)in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08
                                 );
        auVar9._4_60_ = extraout_var;
        auVar2 = vfmadd213ss_fma(auVar9._0_16_,ZEXT416((uint)fVar5),ZEXT416((uint)local_f0));
        local_f0 = auVar2._0_4_;
      }
    }
    for (local_174 = 0; local_174 < (int)(uint)*(byte *)(CONCAT44(uStack_32c,fVar19) + 0x35);
        local_174 = local_174 + 1) {
      bVar3 = SameHemisphere((Vector3f *)&local_10,(Vector3f *)&local_2c);
      if (bVar3) {
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::TopOrBottomBxDF
                  (&local_188);
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::TopOrBottomBxDF
                  (&local_198);
        if ((local_e9 & 1) == 0) {
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::operator=
                    (&local_188,(DielectricInterfaceBxDF *)CONCAT44(uStack_32c,fVar19));
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::operator=
                    (&local_198,(IdealDiffuseBxDF *)(CONCAT44(uStack_32c,fVar19) + 0xc));
        }
        else {
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::operator=
                    (&local_188,(IdealDiffuseBxDF *)(CONCAT44(uStack_32c,fVar19) + 0xc));
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::operator=
                    (&local_198,(DielectricInterfaceBxDF *)CONCAT44(uStack_32c,fVar19));
        }
        PDF::anon_class_8_1_ba1d750b::operator()
                  ((anon_class_8_1_ba1d750b *)
                   CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
        PDF::anon_class_8_1_ba1d750b::operator()
                  ((anon_class_8_1_ba1d750b *)
                   CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
        PDF::anon_class_8_1_ba1d750b::operator()
                  ((anon_class_8_1_ba1d750b *)
                   CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
        Point2<float>::Point2
                  ((Point2<float> *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                  ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                   (Point2f *)in_stack_fffffffffffffcf8,(TransportMode)in_stack_fffffffffffffcf4,
                   in_stack_fffffffffffffcf0);
        bVar3 = BSDFSample::operator_cast_to_bool((BSDFSample *)&stack0xfffffffffffffe38);
        if ((!bVar3) ||
           (((in_stack_fffffffffffffe50 == 0.0 && (!NAN(in_stack_fffffffffffffe50))) ||
            (bVar3 = BSDFSample::IsReflection((BSDFSample *)0x83630a), bVar3)))) {
          FVar6 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
                            ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                              *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                             in_stack_fffffffffffffd38,
                             (Vector3f *)
                             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                             in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28);
          local_f0 = FVar6 + local_f0;
        }
        else {
          PDF::anon_class_8_1_ba1d750b::operator()
                    ((anon_class_8_1_ba1d750b *)
                     CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
          PDF::anon_class_8_1_ba1d750b::operator()
                    ((anon_class_8_1_ba1d750b *)
                     CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
          PDF::anon_class_8_1_ba1d750b::operator()
                    ((anon_class_8_1_ba1d750b *)
                     CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
          Point2<float>::Point2
                    ((Point2<float> *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
          operator~(local_4c);
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                    ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                     (Point2f *)in_stack_fffffffffffffcf8,(TransportMode)in_stack_fffffffffffffcf4,
                     in_stack_fffffffffffffcf0);
          bVar3 = BSDFSample::operator_cast_to_bool((BSDFSample *)&stack0xfffffffffffffe0c);
          if (bVar3) {
            auVar17 = (undefined1  [56])0x0;
            if (((local_1dc != 0.0) || (NAN(local_1dc))) &&
               (bVar3 = BSDFSample::IsReflection((BSDFSample *)0x836434), !bVar3)) {
              VVar18 = Tuple3<pbrt::Vector3,_float>::operator-
                                 ((Tuple3<pbrt::Vector3,_float> *)
                                  CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
              local_208 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar11._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar11._8_56_ = auVar17;
              local_210 = vmovlpd_avx(auVar11._0_16_);
              local_200 = local_210;
              VVar18 = Tuple3<pbrt::Vector3,_float>::operator-
                                 ((Tuple3<pbrt::Vector3,_float> *)
                                  CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
              local_228 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
              auVar12._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
              auVar12._8_56_ = auVar17;
              local_230 = vmovlpd_avx(auVar12._0_16_);
              local_21c = local_230;
              local_214 = local_228;
              FVar6 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
                                ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                  *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                 in_stack_fffffffffffffd38,
                                 (Vector3f *)
                                 CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                 in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28);
              local_f0 = FVar6 + local_f0;
            }
          }
        }
      }
      else {
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::TopOrBottomBxDF
                  (&local_240);
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::TopOrBottomBxDF
                  (&local_250);
        if ((local_e9 & 1) == 0) {
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::operator=
                    (&local_240,(IdealDiffuseBxDF *)(CONCAT44(uStack_32c,fVar19) + 0xc));
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::operator=
                    (&local_250,(DielectricInterfaceBxDF *)CONCAT44(uStack_32c,fVar19));
        }
        else {
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::operator=
                    (&local_240,(DielectricInterfaceBxDF *)CONCAT44(uStack_32c,fVar19));
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::operator=
                    (&local_250,(IdealDiffuseBxDF *)(CONCAT44(uStack_32c,fVar19) + 0xc));
        }
        local_254 = PDF::anon_class_8_1_ba1d750b::operator()
                              ((anon_class_8_1_ba1d750b *)
                               CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
        PDF::anon_class_8_1_ba1d750b::operator()
                  ((anon_class_8_1_ba1d750b *)
                   CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
        PDF::anon_class_8_1_ba1d750b::operator()
                  ((anon_class_8_1_ba1d750b *)
                   CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
        Point2<float>::Point2
                  ((Point2<float> *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
        TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                  ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                   CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                   in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                   (Point2f *)in_stack_fffffffffffffcf8,(TransportMode)in_stack_fffffffffffffcf4,
                   in_stack_fffffffffffffcf0);
        bVar3 = BSDFSample::operator_cast_to_bool(&local_280);
        if (((bVar3) &&
            ((local_280.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0 ||
             (NAN(local_280.wi.super_Tuple3<pbrt::Vector3,_float>.z))))) &&
           (bVar3 = BSDFSample::IsReflection((BSDFSample *)0x836630), !bVar3)) {
          local_254 = PDF::anon_class_8_1_ba1d750b::operator()
                                ((anon_class_8_1_ba1d750b *)
                                 CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
          PDF::anon_class_8_1_ba1d750b::operator()
                    ((anon_class_8_1_ba1d750b *)
                     CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
          PDF::anon_class_8_1_ba1d750b::operator()
                    ((anon_class_8_1_ba1d750b *)
                     CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
          Point2<float>::Point2
                    ((Point2<float> *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98);
          local_25c = local_288;
          operator~(local_4c);
          TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Sample_f
                    ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                     (Point2f *)in_stack_fffffffffffffcf8,(TransportMode)in_stack_fffffffffffffcf4,
                     in_stack_fffffffffffffcf0);
          bVar3 = BSDFSample::operator_cast_to_bool(&local_2ac);
          if (bVar3) {
            auVar17 = (undefined1  [56])0x0;
            if (((local_2ac.wi.super_Tuple3<pbrt::Vector3,_float>.z != 0.0) ||
                (NAN(local_2ac.wi.super_Tuple3<pbrt::Vector3,_float>.z))) &&
               (bVar3 = BSDFSample::IsReflection((BSDFSample *)0x83671e), !bVar3)) {
              TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                        ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *)
                         CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
              bVar3 = IsSpecular(Unset);
              if (bVar3) {
                VVar18 = Tuple3<pbrt::Vector3,_float>::operator-
                                   ((Tuple3<pbrt::Vector3,_float> *)
                                    CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
                in_stack_fffffffffffffd40 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
                auVar13._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                auVar13._8_56_ = auVar17;
                in_stack_fffffffffffffd38 = (Vector3f *)vmovlpd_avx(auVar13._0_16_);
                FVar6 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
                                  ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                    *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                   in_stack_fffffffffffffd38,
                                   (Vector3f *)
                                   CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                   in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28);
                local_f0 = FVar6 + local_f0;
              }
              else {
                TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::Flags
                          ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *
                           )CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
                bVar3 = IsSpecular(Unset);
                if (bVar3) {
                  VVar18 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))
                  ;
                  in_stack_fffffffffffffd34 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar14._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar14._8_56_ = auVar17;
                  uVar1 = vmovlpd_avx(auVar14._0_16_);
                  in_stack_fffffffffffffd2c = (TransportMode)uVar1;
                  in_stack_fffffffffffffd30 = (undefined4)((ulong)uVar1 >> 0x20);
                  FVar6 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                          PDF((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                              in_stack_fffffffffffffd38,
                              (Vector3f *)
                              CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                              in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28);
                  local_f0 = FVar6 + local_f0;
                }
                else {
                  VVar18 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))
                  ;
                  in_stack_fffffffffffffd10 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar15._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar15._8_56_ = auVar17;
                  in_stack_fffffffffffffcf8 = (Vector3f *)vmovlpd_avx(auVar15._0_16_);
                  in_stack_fffffffffffffd08 = in_stack_fffffffffffffcf8;
                  in_stack_fffffffffffffca4 =
                       TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::PDF
                                 ((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                                   *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                  in_stack_fffffffffffffd38,
                                  (Vector3f *)
                                  CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                                  in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28);
                  auVar17 = extraout_var_01;
                  VVar18 = Tuple3<pbrt::Vector3,_float>::operator-
                                     ((Tuple3<pbrt::Vector3,_float> *)
                                      CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0))
                  ;
                  in_stack_fffffffffffffcf4 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
                  auVar16._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
                  auVar16._8_56_ = auVar17;
                  uVar1 = vmovlpd_avx(auVar16._0_16_);
                  in_stack_fffffffffffffcf0 = (BxDFReflTransFlags)((ulong)uVar1 >> 0x20);
                  FVar6 = TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::
                          PDF((TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>
                               *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                              in_stack_fffffffffffffd38,
                              (Vector3f *)
                              CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                              in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28);
                  local_f0 = (in_stack_fffffffffffffca4 + FVar6) / 2.0 + local_f0;
                }
              }
            }
          }
        }
      }
    }
    FVar6 = Lerp(0.9,0.07957747,local_f0 / (float)*(byte *)(CONCAT44(uStack_32c,fVar19) + 0x35));
    return FVar6;
  }
  LogFatal<char_const(&)[39]>
            ((LogLevel)in_stack_fffffffffffffd04,(char *)in_stack_fffffffffffffcf8,
             (int)in_stack_fffffffffffffcf4,
             (char *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8),
             (char (*) [39])CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
}

Assistant:

PBRT_CPU_GPU
    Float PDF(Vector3f wo, Vector3f wi, TransportMode mode,
              BxDFReflTransFlags sampleFlags = BxDFReflTransFlags::All) const {
        CHECK(sampleFlags == BxDFReflTransFlags::All);  // for now
        // Set _wi_ and _wi_ for layered BSDF evaluation
        if (config.twoSided && wo.z < 0) {
            // BIG WIN
            wo = -wo;
            wi = -wi;
        }

        // Declare _RNG_ for layered BSDF evaluation
        RNG rng(Hash(GetOptions().seed, wo), Hash(wi));
        auto r = [&rng]() {
            return std::min<Float>(rng.Uniform<Float>(), OneMinusEpsilon);
        };

        bool enteredTop = wo.z > 0;
        Float pdfSum = 0;
        // Update _pdfSum_ for reflection at the entrance layer
        if (SameHemisphere(wo, wi)) {
            if (enteredTop)
                pdfSum += config.nSamples *
                          top.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
            else
                pdfSum += config.nSamples *
                          bottom.PDF(wo, wi, mode, BxDFReflTransFlags::Reflection);
        }

        for (int s = 0; s < config.nSamples; ++s) {
            // Evaluate layered BSDF PDF sample
            if (SameHemisphere(wo, wi)) {
                // Evaluate TRT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> rInterface, tInterface;
                if (enteredTop) {
                    rInterface = &bottom;
                    tInterface = &top;
                } else {
                    rInterface = &top;
                    tInterface = &bottom;
                }
                // Sample _tInterface_ to get direction into the layers
                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = tInterface.Sample_f(wo, uc, u, mode);

                // Update _pdfSum_ accounting for TRT scattering events
                if (!wos || wos.wi.z == 0 || wos.IsReflection()) {
                    pdfSum += tInterface.PDF(wo, wi, mode);
                } else {
                    uc = r();
                    u = Point2f(r(), r());
                    BSDFSample wis = tInterface.Sample_f(wi, uc, u, ~mode);
                    if (!wis || wis.wi.z == 0 || wis.IsReflection())
                        continue;
                    // if (IsSpecular(tInterface.Flags()))
                    pdfSum += rInterface.PDF(-wos.wi, -wis.wi, mode);
                }

            } else {
                // Evaluate TT term for PDF estimate
                TopOrBottomBxDF<TopBxDF, BottomBxDF> toInterface, tiInterface;
                if (enteredTop) {
                    toInterface = &top;
                    tiInterface = &bottom;
                } else {
                    toInterface = &bottom;
                    tiInterface = &top;
                }

                Float uc = r();
                Point2f u(r(), r());
                BSDFSample wos = toInterface.Sample_f(wo, uc, u, mode);
                if (!wos || wos.wi.z == 0 || wos.IsReflection())
                    continue;

                uc = r();
                u = Point2f(r(), r());
                BSDFSample wis = tiInterface.Sample_f(wi, uc, u, ~mode);
                if (!wis || wis.wi.z == 0 || wis.IsReflection())
                    continue;

                if (IsSpecular(toInterface.Flags()))
                    pdfSum += tiInterface.PDF(-wos.wi, wi, mode);
                else if (IsSpecular(tiInterface.Flags()))
                    pdfSum += toInterface.PDF(wo, -wis.wi, mode);
                else
                    pdfSum += (toInterface.PDF(wo, -wis.wi, mode) +
                               tiInterface.PDF(-wos.wi, wi, mode)) /
                              2;
            }
        }
        // Return mixture of PDF estimate and constant PDF
        return Lerp(.9, 1 / (4 * Pi), pdfSum / config.nSamples);
    }